

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

void mp_destroy(mempool_t *mp)

{
  int local_14;
  int k;
  mempool_t *mp_local;
  
  for (local_14 = 0; local_14 < mp->n; local_14 = local_14 + 1) {
    free((mp->buf[local_14]->b).data);
    free(mp->buf[local_14]);
  }
  free(mp->buf);
  free(mp);
  return;
}

Assistant:

static void mp_destroy(mempool_t *mp)
{
    int k;
    for (k = 0; k < mp->n; ++k) {
        free(mp->buf[k]->b.data);
        free(mp->buf[k]);
    }
    free(mp->buf);
    free(mp);
}